

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_capi_appender.cpp
# Opt level: O0

void TestAppenderError(duckdb_appender *appender,string *expected)

{
  StringRef capturedExpression;
  StringRef capturedExpression_00;
  undefined1 uVar1;
  ExprLhs<bool> EVar2;
  ExprLhs<const_char_*const_&> expr;
  string *in_RSI;
  undefined8 *in_RDI;
  AssertionHandler catchAssertionHandler_1;
  AssertionHandler catchAssertionHandler;
  char *error;
  undefined4 in_stack_fffffffffffffe38;
  Flags in_stack_fffffffffffffe3c;
  undefined6 in_stack_fffffffffffffe40;
  undefined1 in_stack_fffffffffffffe46;
  undefined1 in_stack_fffffffffffffe47;
  StringRef *in_stack_fffffffffffffe48;
  SourceLineInfo *this;
  AssertionHandler *in_stack_fffffffffffffe50;
  char *pcVar3;
  char *in_stack_fffffffffffffe58;
  allocator *paVar4;
  SourceLineInfo *this_00;
  AssertionHandler *in_stack_fffffffffffffe70;
  ExprLhs<const_char_*const_&> *in_stack_fffffffffffffe78;
  SourceLineInfo local_150;
  StringRef local_140;
  undefined8 local_e8;
  char **local_c8;
  SourceLineInfo local_80;
  StringRef local_70;
  char *local_18;
  string *local_10;
  
  local_10 = in_RSI;
  local_18 = (char *)duckdb_appender_error(*in_RDI);
  local_70 = operator____catch_sr
                       ((char *)CONCAT17(in_stack_fffffffffffffe47,
                                         CONCAT16(in_stack_fffffffffffffe46,
                                                  in_stack_fffffffffffffe40)),
                        CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
  this_00 = &local_80;
  Catch::SourceLineInfo::SourceLineInfo
            (this_00,
             "/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/test/api/capi/test_capi_appender.cpp"
             ,0x23);
  Catch::StringRef::StringRef
            ((StringRef *)in_stack_fffffffffffffe50,(char *)in_stack_fffffffffffffe48);
  capturedExpression.m_size = (size_type)this_00;
  capturedExpression.m_start = in_stack_fffffffffffffe58;
  Catch::AssertionHandler::AssertionHandler
            (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,
             (SourceLineInfo *)
             CONCAT17(in_stack_fffffffffffffe47,
                      CONCAT16(in_stack_fffffffffffffe46,in_stack_fffffffffffffe40)),
             capturedExpression,in_stack_fffffffffffffe3c);
  expr = Catch::Decomposer::operator<=
                   ((Decomposer *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                    (char **)0x3a0d37);
  local_e8 = 0;
  local_c8 = expr.m_lhs;
  Catch::ExprLhs<char_const*const&>::operator!=
            (in_stack_fffffffffffffe78,(void **)in_stack_fffffffffffffe70);
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)
             CONCAT17(in_stack_fffffffffffffe47,
                      CONCAT16(in_stack_fffffffffffffe46,in_stack_fffffffffffffe40)),
             (ITransientExpression *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
  Catch::BinaryExpr<const_char_*const_&,_const_std::nullptr_t_&>::~BinaryExpr
            ((BinaryExpr<const_char_*const_&,_const_std::nullptr_t_&> *)0x3a0d9a);
  Catch::AssertionHandler::complete
            ((AssertionHandler *)
             CONCAT17(in_stack_fffffffffffffe47,
                      CONCAT16(in_stack_fffffffffffffe46,in_stack_fffffffffffffe40)));
  Catch::AssertionHandler::~AssertionHandler
            ((AssertionHandler *)
             CONCAT17(in_stack_fffffffffffffe47,
                      CONCAT16(in_stack_fffffffffffffe46,in_stack_fffffffffffffe40)));
  local_140 = operator____catch_sr
                        ((char *)CONCAT17(in_stack_fffffffffffffe47,
                                          CONCAT16(in_stack_fffffffffffffe46,
                                                   in_stack_fffffffffffffe40)),
                         CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
  this = &local_150;
  Catch::SourceLineInfo::SourceLineInfo
            (this,
             "/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/test/api/capi/test_capi_appender.cpp"
             ,0x24);
  Catch::StringRef::StringRef((StringRef *)in_stack_fffffffffffffe50,(char *)this);
  capturedExpression_00.m_size = (size_type)this_00;
  capturedExpression_00.m_start = in_stack_fffffffffffffe58;
  Catch::AssertionHandler::AssertionHandler
            (in_stack_fffffffffffffe50,(StringRef *)this,
             (SourceLineInfo *)
             CONCAT17(in_stack_fffffffffffffe47,
                      CONCAT16(in_stack_fffffffffffffe46,in_stack_fffffffffffffe40)),
             capturedExpression_00,in_stack_fffffffffffffe3c);
  paVar4 = (allocator *)&stack0xfffffffffffffe77;
  pcVar3 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&stack0xfffffffffffffe78,pcVar3,paVar4);
  uVar1 = duckdb::StringUtil::Contains((string *)&stack0xfffffffffffffe78,local_10);
  EVar2 = Catch::Decomposer::operator<=
                    ((Decomposer *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                     false);
  Catch::AssertionHandler::handleExpr<bool>(in_stack_fffffffffffffe70,(ExprLhs<bool> *)expr.m_lhs);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffe78);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffe77);
  Catch::AssertionHandler::complete
            ((AssertionHandler *)CONCAT17(uVar1,CONCAT16(EVar2.m_lhs,in_stack_fffffffffffffe40)));
  Catch::AssertionHandler::~AssertionHandler
            ((AssertionHandler *)CONCAT17(uVar1,CONCAT16(EVar2.m_lhs,in_stack_fffffffffffffe40)));
  return;
}

Assistant:

void TestAppenderError(duckdb_appender &appender, const string &expected) {
	auto error = duckdb_appender_error(appender);
	REQUIRE(error != nullptr);
	REQUIRE(duckdb::StringUtil::Contains(error, expected));
}